

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O0

int pkey_gost_ec_ctrl_str_512(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  size_t sVar2;
  byte *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  R3410_ec_params *p;
  char *in_stack_00000010;
  int param_nid;
  uint in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  R3410_ec_params *pRVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp(in_RSI,"paramset");
  if (iVar1 == 0) {
    if (in_RDX == (byte *)0x0) {
      iVar1 = 0;
    }
    else {
      sVar2 = strlen((char *)in_RDX);
      if (sVar2 == 1) {
        iVar1 = toupper((uint)*in_RDX);
        if (((iVar1 != 0x41) && (iVar1 != 0x42)) && (iVar1 != 0x43)) {
          return 0;
        }
      }
      else {
        pRVar4 = R3410_2012_512_paramset;
        iVar1 = OBJ_txt2nid((char *)in_RDX);
        if (iVar1 == 0) {
          return 0;
        }
        while( true ) {
          uVar3 = in_stack_ffffffffffffffc8 & 0xffffff;
          if (pRVar4->nid != 0) {
            uVar3 = CONCAT13(pRVar4->nid != iVar1,(int3)in_stack_ffffffffffffffc8);
          }
          if ((char)(uVar3 >> 0x18) == '\0') break;
          pRVar4 = pRVar4 + 1;
          in_stack_ffffffffffffffc8 = uVar3;
        }
        if (pRVar4->nid == 0) {
          ERR_GOST_error((int)((ulong)pRVar4 >> 0x20),(int)pRVar4,
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,uVar3),0);
          return 0;
        }
      }
      iVar1 = pkey_gost_ctrl((EVP_PKEY_CTX *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI);
    }
  }
  else {
    iVar1 = pkey_gost_ec_ctrl_str_common((EVP_PKEY_CTX *)value,in_stack_00000010,(char *)p);
  }
  return iVar1;
}

Assistant:

static int pkey_gost_ec_ctrl_str_512(EVP_PKEY_CTX *ctx,
                                     const char *type, const char *value)
{
    int param_nid = NID_undef;

    if (strcmp(type, param_ctrl_string))
      return pkey_gost_ec_ctrl_str_common(ctx, type, value);

    if (!value)
        return 0;

    if (strlen(value) == 1) {
        switch (toupper((unsigned char)value[0])) {
        case 'A':
            param_nid = NID_id_tc26_gost_3410_2012_512_paramSetA;
            break;

        case 'B':
            param_nid = NID_id_tc26_gost_3410_2012_512_paramSetB;
            break;

        case 'C':
            param_nid = NID_id_tc26_gost_3410_2012_512_paramSetC;
            break;

        default:
            return 0;
        }
    } else {
        R3410_ec_params *p = R3410_2012_512_paramset;
        param_nid = OBJ_txt2nid(value);
        if (param_nid == NID_undef)
            return 0;

        while (p->nid != NID_undef && p->nid != param_nid)
            p++;

        if (p->nid == NID_undef) {
            GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_512,
                    GOST_R_INVALID_PARAMSET);
            return 0;
        }
    }

    return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_GOST_PARAMSET, param_nid, NULL);
}